

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject * luaC_newobj(lua_State *L,lu_byte tt,size_t sz)

{
  GCObject *pGVar1;
  size_t sz_local;
  lu_byte tt_local;
  lua_State *L_local;
  
  pGVar1 = luaC_newobjdt(L,tt,sz,0);
  return pGVar1;
}

Assistant:

GCObject *luaC_newobj (lua_State *L, lu_byte tt, size_t sz) {
  return luaC_newobjdt(L, tt, sz, 0);
}